

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# VehicleState.cc
# Opt level: O3

MatrixXd * __thiscall
VehicleState::Propagator::GetRangeAndRateJac
          (MatrixXd *__return_storage_ptr__,Propagator *this,Vector3d *pos_station_ecef)

{
  undefined8 *puVar1;
  double dVar2;
  double *pdVar3;
  long lVar4;
  double dVar5;
  double dVar6;
  double dVar7;
  double dVar8;
  Matrix3d R_ecef2eci;
  vector<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_std::allocator<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>_>
  local_130;
  double local_118;
  double dStack_110;
  double local_108;
  double dStack_100;
  double local_f8;
  double dStack_f0;
  double local_e8;
  double dStack_e0;
  double local_d0;
  double local_c8;
  double dStack_c0;
  double local_b8;
  double dStack_b0;
  double local_a8;
  double dStack_a0;
  double local_98;
  double dStack_90;
  double local_88;
  undefined8 uStack_80;
  Matrix3d local_78;
  undefined8 local_30;
  undefined8 local_28;
  undefined8 local_20;
  
  dVar2 = this->t_JD_;
  dVar6 = this->t_;
  local_108 = this->earthrotationspeed_;
  dStack_100 = 0.0;
  local_f8 = (this->pos_).super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.
             m_data.array[0];
  dStack_f0 = (this->pos_).super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.
              m_data.array[1];
  dVar5 = (this->pos_).super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.m_data
          .array[2];
  local_e8 = (this->vel_).super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.
             m_data.array[0];
  dStack_e0 = (this->vel_).super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.
              m_data.array[1];
  local_d0 = (this->vel_).super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.
             m_data.array[2];
  local_130.
  super__Vector_base<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_std::allocator<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)operator_new(0x120);
  local_130.
  super__Vector_base<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_std::allocator<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage =
       local_130.
       super__Vector_base<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_std::allocator<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>_>
       ._M_impl.super__Vector_impl_data._M_start + 4;
  lVar4 = 0;
  do {
    *(undefined8 *)
     ((long)((local_130.
              super__Vector_base<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_std::allocator<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>_>
              ._M_impl.super__Vector_impl_data._M_start)->
            super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.m_data.array +
     lVar4) = 0x3ff0000000000000;
    puVar1 = (undefined8 *)
             ((long)((local_130.
                      super__Vector_base<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_std::allocator<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>_>
                      ._M_impl.super__Vector_impl_data._M_start)->
                    super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.m_data.
                    array + lVar4 + 8);
    *puVar1 = 0;
    puVar1[1] = 0;
    *(undefined8 *)
     ((long)((local_130.
              super__Vector_base<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_std::allocator<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>_>
              ._M_impl.super__Vector_impl_data._M_start)->
            super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.m_data.array +
     lVar4 + 0x18) = 0;
    *(undefined8 *)
     ((long)((local_130.
              super__Vector_base<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_std::allocator<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>_>
              ._M_impl.super__Vector_impl_data._M_start)->
            super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.m_data.array +
     lVar4 + 0x20) = 0x3ff0000000000000;
    puVar1 = (undefined8 *)
             ((long)((local_130.
                      super__Vector_base<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_std::allocator<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>_>
                      ._M_impl.super__Vector_impl_data._M_start)->
                    super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.m_data.
                    array + lVar4 + 0x28);
    *puVar1 = 0;
    puVar1[1] = 0;
    *(undefined8 *)
     ((long)((local_130.
              super__Vector_base<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_std::allocator<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>_>
              ._M_impl.super__Vector_impl_data._M_start)->
            super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.m_data.array +
     lVar4 + 0x38) = 0;
    *(undefined8 *)
     ((long)((local_130.
              super__Vector_base<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_std::allocator<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>_>
              ._M_impl.super__Vector_impl_data._M_start)->
            super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.m_data.array +
     lVar4 + 0x40) = 0x3ff0000000000000;
    lVar4 = lVar4 + 0x48;
  } while (lVar4 != 0x120);
  local_130.
  super__Vector_base<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_std::allocator<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>_>
  ._M_impl.super__Vector_impl_data._M_finish =
       local_130.
       super__Vector_base<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_std::allocator<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>_>
       ._M_impl.super__Vector_impl_data._M_start + 4;
  Util::ECEF2ECI(&local_78,dVar2 + dVar6 / 86400.0,this->gravmodel_->nut80ptr_,
                 this->gravmodel_->iau1980ptr_,&local_130);
  local_a8 = local_78.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.
             array[0];
  dStack_a0 = local_78.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data
              .array[1];
  local_c8 = (pos_station_ecef->super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>).
             m_storage.m_data.array[0];
  dStack_c0 = (pos_station_ecef->super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>).
              m_storage.m_data.array[1];
  dVar2 = (pos_station_ecef->super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>).m_storage
          .m_data.array[1];
  dVar6 = (pos_station_ecef->super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>).m_storage
          .m_data.array[2];
  local_98 = local_78.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.
             array[3];
  dStack_90 = local_78.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data
              .array[4];
  local_b8 = local_78.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.
             array[6];
  dStack_b0 = local_78.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data
              .array[7];
  local_118 = local_78.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data
              .array[5];
  dStack_110 = local_78.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.
               m_data.array[6];
  local_88 = local_78.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.
             array[8];
  uStack_80 = 0;
  local_30 = 2;
  local_28 = 6;
  local_20 = 0;
  Eigen::PlainObjectBase<Eigen::Matrix<double,-1,-1,0,-1,-1>>::
  PlainObjectBase<Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,_1,_1,0,_1,_1>>>
            ((PlainObjectBase<Eigen::Matrix<double,_1,_1,0,_1,_1>> *)__return_storage_ptr__,
             (DenseBase<Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_Eigen::Matrix<double,__1,__1,_0,__1,__1>_>_>
              *)&local_30);
  dVar7 = local_98 * dVar2 + local_a8 * local_c8 + local_b8 * dVar6;
  dVar8 = dStack_90 * dVar2 + dStack_a0 * local_c8 + dStack_b0 * dVar6;
  local_f8 = local_f8 - dVar7;
  dStack_110 = dStack_f0 - dVar8;
  local_e8 = local_e8 - -local_108 * dVar8;
  dStack_e0 = dStack_e0 - local_108 * dVar7;
  dVar5 = dVar5 - (local_88 * dVar6 + local_118 * dVar2 +
                  local_78.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.
                  m_data.array[2] * local_c8);
  dVar6 = local_f8 * local_f8;
  dVar7 = dVar5 * dVar5;
  dVar2 = SQRT(dStack_110 * dStack_110 + dVar6 + dVar7);
  pdVar3 = (__return_storage_ptr__->super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>
           ).m_storage.m_data;
  *pdVar3 = local_f8 / dVar2;
  lVar4 = (__return_storage_ptr__->super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>)
          .m_storage.m_rows;
  pdVar3[lVar4] = dStack_110 / dVar2;
  pdVar3[lVar4 * 2] = dVar5 / dVar2;
  local_118 = dStack_110 * dStack_110;
  local_108 = dStack_110;
  dStack_100 = dStack_110;
  dStack_f0 = dStack_110;
  dVar2 = pow(dVar6 + local_118 + dVar7,1.5);
  pdVar3 = (__return_storage_ptr__->super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>
           ).m_storage.m_data;
  pdVar3[1] = ((local_e8 * dVar7 + (local_e8 * local_118 - dStack_e0 * local_f8 * local_108)) -
              local_d0 * local_f8 * dVar5) / dVar2;
  lVar4 = (__return_storage_ptr__->super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>)
          .m_storage.m_rows;
  pdVar3[lVar4 + 1] =
       ((dVar7 * dStack_e0 + (dVar6 * dStack_e0 - local_e8 * local_108 * local_f8)) -
       local_d0 * local_108 * dVar5) / dVar2;
  pdVar3[lVar4 * 2 + 1] =
       (((local_118 * local_d0 - local_e8 * dVar5 * local_f8) + local_118 * local_d0) -
       dStack_e0 * dVar5 * local_108) / dVar2;
  pdVar3[lVar4 * 3 + 1] = *pdVar3;
  pdVar3[lVar4 * 4 + 1] = pdVar3[lVar4];
  pdVar3[lVar4 * 5 + 1] = pdVar3[lVar4 * 2];
  if (local_130.
      super__Vector_base<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_std::allocator<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>_>
      ._M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_130.
                    super__Vector_base<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_std::allocator<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>_>
                    ._M_impl.super__Vector_impl_data._M_start,
                    (long)local_130.
                          super__Vector_base<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_std::allocator<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>_>
                          ._M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)local_130.
                          super__Vector_base<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_std::allocator<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>_>
                          ._M_impl.super__Vector_impl_data._M_start);
  }
  return __return_storage_ptr__;
}

Assistant:

Eigen::MatrixXd Propagator::GetRangeAndRateJac(Eigen::Vector3d pos_station_ecef){

		//locals
		double JD_UTC = this->t_JD_ + this->t_/(24.0*60.0*60.0); //current UTC Julian Date in days
		double earthrot = this->earthrotationspeed_;
		Eigen::Vector3d pos_craft = this->pos_;
		Eigen::Vector3d vel_craft = this->vel_;
		std::vector<Eigen::Matrix3d> matvec(4, Eigen::Matrix3d::Identity(3,3));
		Eigen::Matrix3d R_ecef2eci = Util::ECEF2ECI(JD_UTC, this->gravmodel_->nut80ptr_, this->gravmodel_->iau1980ptr_, &matvec); //matrix rotating from ECEF2ECI

		//convert station position to ECI
		Eigen::Vector3d pos_station = R_ecef2eci*pos_station_ecef;

		//station ECI velocity
		Eigen::Vector3d vel_station;
		vel_station[0] = -1.0*earthrot*pos_station[1];
		vel_station[1] = earthrot*pos_station[0];
		vel_station[2] = 0.0;

		//relative position and velocity
		Eigen::Vector3d rel_pos = pos_craft - pos_station;
		Eigen::Vector3d rel_vel  = vel_craft - vel_station;

		//initialize H
		Eigen::MatrixXd H = Eigen::MatrixXd::Zero(2,6);

		//range partials
		H(0,0) = rel_pos[0]/rel_pos.norm();
		H(0,1) = rel_pos[1]/rel_pos.norm();
		H(0,2) = rel_pos[2]/rel_pos.norm();

		//range rate partials
		double rel32 = pow(pow(rel_pos[0],2.0) + pow(rel_pos[1],2.0) + pow(rel_pos[2],2.0), 1.5);
		H(1,0) = (rel_vel[0]*pow(rel_pos[1],2.0) - rel_pos[0]*rel_vel[1]*rel_pos[1] + rel_vel[0]*pow(rel_pos[2],2.0) - rel_pos[0]*rel_vel[2]*rel_pos[2])/rel32;
		H(1,1) = (rel_vel[1]*pow(rel_pos[0],2.0) - rel_pos[1]*rel_vel[0]*rel_pos[0] + rel_vel[1]*pow(rel_pos[2],2.0) - rel_pos[1]*rel_vel[2]*rel_pos[2])/rel32;
		H(1,2) = (rel_vel[2]*pow(rel_pos[1],2.0) - rel_pos[2]*rel_vel[0]*rel_pos[0] + rel_vel[2]*pow(rel_pos[1],2.0) - rel_pos[2]*rel_vel[1]*rel_pos[1])/rel32;
		H(1,3) = H(0,0);
		H(1,4) = H(0,1);
		H(1,5) = H(0,2);

		return H;
	}